

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

char * __thiscall tinyxml2::XMLNode::ParseDeep(XMLNode *this,char *p,StrPair *parentEnd)

{
  XMLDocument *pXVar1;
  int iVar2;
  char *pcVar3;
  XMLNode *this_00;
  XMLElement *this_01;
  char *q;
  bool bVar4;
  bool mismatch;
  XMLElement *ele;
  XMLDeclaration *decl;
  undefined1 local_48 [8];
  StrPair endTag;
  XMLNode *node;
  StrPair *parentEnd_local;
  char *p_local;
  XMLNode *this_local;
  
  parentEnd_local = (StrPair *)p;
  do {
    bVar4 = false;
    if (parentEnd_local != (StrPair *)0x0) {
      bVar4 = (char)parentEnd_local->_flags != '\0';
    }
    if (!bVar4) goto LAB_002952b0;
    endTag._end = (char *)0x0;
    pcVar3 = XMLDocument::Identify(this->_document,(char *)parentEnd_local,(XMLNode **)&endTag._end)
    ;
    if (endTag._end == (char *)0x0) goto LAB_002952b0;
    StrPair::StrPair((StrPair *)local_48);
    parentEnd_local =
         (StrPair *)
         (**(code **)(*(long *)endTag._end + 0x88))(endTag._end,pcVar3,(StrPair *)local_48);
    if ((XMLNode *)parentEnd_local == (XMLNode *)0x0) {
      DeleteNode((XMLNode *)endTag._end);
      bVar4 = XMLDocument::Error(this->_document);
      if (!bVar4) {
        XMLDocument::SetError(this->_document,XML_ERROR_PARSING,(char *)0x0,(char *)0x0);
      }
      decl._0_4_ = 3;
    }
    else {
      this_00 = (XMLNode *)(**(code **)(*(long *)endTag._end + 0x20))();
      if ((this_00 == (XMLNode *)0x0) ||
         (bVar4 = NoChildren(&this->_document->super_XMLNode), bVar4)) {
        this_01 = (XMLElement *)(*(code *)**(undefined8 **)endTag._end)();
        if (this_01 == (XMLElement *)0x0) {
LAB_0029526e:
          InsertEndChild(this,(XMLNode *)endTag._end);
          decl._0_4_ = 0;
        }
        else {
          iVar2 = XMLElement::ClosingType(this_01);
          if (iVar2 == 2) {
            if (parentEnd != (StrPair *)0x0) {
              StrPair::TransferTo(&(this_01->super_XMLNode)._value,parentEnd);
            }
            (**(code **)(**(long **)(endTag._end + 0x50) + 0x28))();
            DeleteNode((XMLNode *)endTag._end);
            decl._0_4_ = 1;
            this_local = (XMLNode *)parentEnd_local;
          }
          else {
            bVar4 = StrPair::Empty((StrPair *)local_48);
            if (bVar4) {
              iVar2 = XMLElement::ClosingType(this_01);
              bVar4 = iVar2 == 0;
            }
            else {
              iVar2 = XMLElement::ClosingType(this_01);
              if (iVar2 == 0) {
                pcVar3 = StrPair::GetStr((StrPair *)local_48);
                q = XMLElement::Name(this_01);
                bVar4 = XMLUtil::StringEqual(pcVar3,q,0x7fffffff);
                bVar4 = !bVar4;
              }
              else {
                bVar4 = true;
              }
            }
            if (!bVar4) goto LAB_0029526e;
            pXVar1 = this->_document;
            pcVar3 = XMLElement::Name(this_01);
            XMLDocument::SetError(pXVar1,XML_ERROR_MISMATCHED_ELEMENT,pcVar3,(char *)0x0);
            DeleteNode((XMLNode *)endTag._end);
            decl._0_4_ = 3;
          }
        }
      }
      else {
        pXVar1 = this->_document;
        pcVar3 = Value(this_00);
        XMLDocument::SetError(pXVar1,XML_ERROR_PARSING_DECLARATION,pcVar3,(char *)0x0);
        DeleteNode(this_00);
        decl._0_4_ = 3;
      }
    }
    StrPair::~StrPair((StrPair *)local_48);
  } while ((int)decl == 0);
  if ((int)decl != 1) {
LAB_002952b0:
    this_local = (XMLNode *)0x0;
  }
  return (char *)this_local;
}

Assistant:

char* XMLNode::ParseDeep( char* p, StrPair* parentEnd )
{
    // This is a recursive method, but thinking about it "at the current level"
    // it is a pretty simple flat list:
    //		<foo/>
    //		<!-- comment -->
    //
    // With a special case:
    //		<foo>
    //		</foo>
    //		<!-- comment -->
    //
    // Where the closing element (/foo) *must* be the next thing after the opening
    // element, and the names must match. BUT the tricky bit is that the closing
    // element will be read by the child.
    //
    // 'endTag' is the end tag for this node, it is returned by a call to a child.
    // 'parentEnd' is the end tag for the parent, which is filled in and returned.

    while( p && *p ) {
        XMLNode* node = 0;

        p = _document->Identify( p, &node );
        if ( node == 0 ) {
            break;
        }

        StrPair endTag;
        p = node->ParseDeep( p, &endTag );
        if ( !p ) {
            DeleteNode( node );
            if ( !_document->Error() ) {
                _document->SetError( XML_ERROR_PARSING, 0, 0 );
            }
            break;
        }

        XMLDeclaration* decl = node->ToDeclaration();
        if ( decl ) {
                // A declaration can only be the first child of a document.
                // Set error, if document already has children.
                if ( !_document->NoChildren() ) {
                        _document->SetError( XML_ERROR_PARSING_DECLARATION, decl->Value(), 0);
                        DeleteNode( decl );
                        break;
                }
        }

        XMLElement* ele = node->ToElement();
        if ( ele ) {
            // We read the end tag. Return it to the parent.
            if ( ele->ClosingType() == XMLElement::CLOSING ) {
                if ( parentEnd ) {
                    ele->_value.TransferTo( parentEnd );
                }
                node->_memPool->SetTracked();   // created and then immediately deleted.
                DeleteNode( node );
                return p;
            }

            // Handle an end tag returned to this level.
            // And handle a bunch of annoying errors.
            bool mismatch = false;
            if ( endTag.Empty() ) {
                if ( ele->ClosingType() == XMLElement::OPEN ) {
                    mismatch = true;
                }
            }
            else {
                if ( ele->ClosingType() != XMLElement::OPEN ) {
                    mismatch = true;
                }
                else if ( !XMLUtil::StringEqual( endTag.GetStr(), ele->Name() ) ) {
                    mismatch = true;
                }
            }
            if ( mismatch ) {
                _document->SetError( XML_ERROR_MISMATCHED_ELEMENT, ele->Name(), 0 );
                DeleteNode( node );
                break;
            }
        }
        InsertEndChild( node );
    }
    return 0;
}